

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndValue(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  char cVar4;
  undefined4 extraout_var;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  ValueType *pVVar6;
  Ch *pCVar7;
  int iVar8;
  ulong uVar9;
  ISchemaValidator **ppIVar10;
  long lVar11;
  ErrorHandlerType *pEVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  int iVar5;
  
  uVar1 = context->patternPropertiesValidatorCount;
  uVar14 = (ulong)uVar1;
  if (uVar1 != 0) {
    if (context->objectPatternValidatorType == kPatternValidatorOnly) {
      bVar3 = 0;
    }
    else {
      uVar14 = (ulong)(uVar1 - 1);
      iVar5 = (*context->patternPropertiesValidators[uVar14]->_vptr_ISchemaValidator[2])();
      bVar3 = (byte)iVar5;
    }
    bVar16 = (int)uVar14 == 0;
    if ((!bVar16) &&
       (iVar5 = (*(*context->patternPropertiesValidators)->_vptr_ISchemaValidator[2])(),
       (char)iVar5 != '\0')) {
      uVar2 = 1;
      do {
        uVar9 = uVar2;
        if (uVar14 == uVar9) break;
        iVar5 = (*context->patternPropertiesValidators[uVar9]->_vptr_ISchemaValidator[2])();
        uVar2 = uVar9 + 1;
      } while ((char)iVar5 != '\0');
      bVar16 = uVar14 <= uVar9;
    }
    if (context->objectPatternValidatorType == kPatternValidatorWithProperty) {
      if ((bVar3 & bVar16) == 0) {
LAB_0012e7c0:
        pEVar12 = context->error_handler;
        ppIVar10 = context->patternPropertiesValidators;
        uVar14 = (ulong)((int)uVar14 + 1);
LAB_0012e7cb:
        (*pEVar12->_vptr_IValidationErrorHandler[0x17])(pEVar12,ppIVar10,uVar14);
        context->invalidCode = kValidateErrorPatternProperties;
        this_00 = GetPatternPropertiesString();
        goto LAB_0012eab0;
      }
    }
    else if (context->objectPatternValidatorType == kPatternValidatorOnly) {
      if (bVar16 == false) {
        pEVar12 = context->error_handler;
        ppIVar10 = context->patternPropertiesValidators;
        goto LAB_0012e7cb;
      }
    }
    else if (bVar3 == 0 && bVar16 == false) goto LAB_0012e7c0;
  }
  if ((this->enum_ != (uint64_t *)0x0) && (context->hasher != (void *)0x0)) {
    iVar5 = (*context->factory->_vptr_ISchemaStateFactory[5])();
    iVar8 = 0xb;
    if (this->enumCount_ != 0) {
      lVar11 = 0;
      do {
        if (this->enum_[lVar11] == CONCAT44(extraout_var,iVar5)) {
          iVar8 = 0xe;
          break;
        }
        lVar11 = lVar11 + 1;
      } while (this->enumCount_ != (SizeType)lVar11);
    }
    if (iVar8 != 0xe) {
      if (iVar8 != 0xb) {
        return false;
      }
      (*context->error_handler->_vptr_IValidationErrorHandler[0x1f])(context->error_handler,0x13);
      context->invalidCode = kValidateErrorEnum;
      this_00 = GetEnumString();
      goto LAB_0012eab0;
    }
  }
  if (context->validatorCount == 0) {
    return true;
  }
  if ((this->allOf_).schemas != (SchemaType **)0x0) {
    uVar1 = (this->allOf_).begin;
    uVar14 = (ulong)uVar1;
    bVar16 = uVar1 < (this->allOf_).count + uVar1;
    if (bVar16) {
      iVar5 = (*context->validators[uVar14]->_vptr_ISchemaValidator[2])();
      cVar4 = (char)iVar5;
      while (cVar4 != '\0') {
        uVar14 = uVar14 + 1;
        bVar16 = uVar14 < (this->allOf_).count + (this->allOf_).begin;
        if (!bVar16) goto LAB_0012e8dc;
        iVar5 = (*context->validators[uVar14]->_vptr_ISchemaValidator[2])();
        cVar4 = (char)iVar5;
      }
      (*context->error_handler->_vptr_IValidationErrorHandler[0x23])
                (context->error_handler,context->validators + (this->allOf_).begin,
                 (ulong)(this->allOf_).count);
      context->invalidCode = kValidateErrorAllOf;
      pVVar6 = GetAllOfString();
      pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::GetString(pVVar6);
      context->invalidKeyword = pCVar7;
      if (bVar16) {
        return false;
      }
    }
  }
LAB_0012e8dc:
  if ((this->anyOf_).schemas == (SchemaType **)0x0) {
LAB_0012e94e:
    if ((this->oneOf_).schemas != (SchemaType **)0x0) {
      uVar1 = (this->oneOf_).begin;
      uVar14 = (ulong)uVar1;
      uVar13 = 0;
      bVar16 = false;
      bVar15 = uVar1 < (this->oneOf_).count + uVar1;
      if (bVar15) {
        bVar16 = false;
        do {
          iVar5 = (*context->validators[uVar14]->_vptr_ISchemaValidator[2])();
          if ((char)iVar5 != '\0') {
            if (bVar16) {
              (*context->error_handler->_vptr_IValidationErrorHandler[0x26])
                        (context->error_handler,(ulong)uVar13,
                         (ulong)((int)uVar14 - (this->oneOf_).begin));
              context->invalidCode = kValidateErrorOneOfMatch;
              pVVar6 = GetOneOfString();
              pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ::GetString(pVVar6);
              context->invalidKeyword = pCVar7;
              if (bVar15) {
                return false;
              }
              break;
            }
            uVar13 = (int)uVar14 - (this->oneOf_).begin;
            bVar16 = true;
          }
          uVar14 = uVar14 + 1;
          bVar15 = uVar14 < (this->oneOf_).count + (this->oneOf_).begin;
        } while (bVar15);
      }
      if (!bVar16) {
        (*context->error_handler->_vptr_IValidationErrorHandler[0x25])
                  (context->error_handler,context->validators + (this->oneOf_).begin,
                   (ulong)(this->oneOf_).count);
        context->invalidCode = kValidateErrorOneOf;
        this_00 = GetOneOfString();
        goto LAB_0012eab0;
      }
    }
    if (this->not_ == (SchemaType *)0x0) {
      return true;
    }
    iVar5 = (*context->validators[this->notValidatorIndex_]->_vptr_ISchemaValidator[2])();
    if ((char)iVar5 == '\0') {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x27])();
    context->invalidCode = kValidateErrorNot;
    this_00 = GetNotString();
  }
  else {
    uVar1 = (this->anyOf_).begin;
    uVar14 = (ulong)uVar1;
    bVar16 = uVar1 < (this->anyOf_).count + uVar1;
    if (bVar16) {
      iVar5 = (*context->validators[uVar14]->_vptr_ISchemaValidator[2])();
      cVar4 = (char)iVar5;
      while (cVar4 == '\0') {
        uVar14 = uVar14 + 1;
        bVar16 = uVar14 < (this->anyOf_).count + (this->anyOf_).begin;
        if (!bVar16) goto LAB_0012e9ca;
        iVar5 = (*context->validators[uVar14]->_vptr_ISchemaValidator[2])();
        cVar4 = (char)iVar5;
      }
      if (bVar16) goto LAB_0012e94e;
    }
LAB_0012e9ca:
    (*context->error_handler->_vptr_IValidationErrorHandler[0x24])
              (context->error_handler,context->validators + (this->anyOf_).begin,
               (ulong)(this->anyOf_).count);
    context->invalidCode = kValidateErrorAnyOf;
    this_00 = GetAnyOfString();
  }
LAB_0012eab0:
  pCVar7 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar7;
  return false;
}

Assistant:

RAPIDJSON_FORCEINLINE bool EndValue(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndValue");
        // Only check pattern properties if we have validators
        if (context.patternPropertiesValidatorCount > 0) {
            bool otherValid = false;
            SizeType count = context.patternPropertiesValidatorCount;
            if (context.objectPatternValidatorType != Context::kPatternValidatorOnly)
                otherValid = context.patternPropertiesValidators[--count]->IsValid();

            bool patternValid = true;
            for (SizeType i = 0; i < count; i++)
                if (!context.patternPropertiesValidators[i]->IsValid()) {
                    patternValid = false;
                    break;
                }

            if (context.objectPatternValidatorType == Context::kPatternValidatorOnly) {
                if (!patternValid) {
                    context.error_handler.PropertyViolations(context.patternPropertiesValidators, count);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
                }
            }
            else if (context.objectPatternValidatorType == Context::kPatternValidatorWithProperty) {
                if (!patternValid || !otherValid) {
                    context.error_handler.PropertyViolations(context.patternPropertiesValidators, count + 1);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
                }
            }
            else if (!patternValid && !otherValid) { // kPatternValidatorWithAdditionalProperty)
                context.error_handler.PropertyViolations(context.patternPropertiesValidators, count + 1);
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
            }
        }

        // For enums only check if we have a hasher
        if (enum_ && context.hasher) {
            const uint64_t h = context.factory.GetHashCode(context.hasher);
            for (SizeType i = 0; i < enumCount_; i++)
                if (enum_[i] == h)
                    goto foundEnum;
            context.error_handler.DisallowedValue(kValidateErrorEnum);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorEnum);
            foundEnum:;
        }

        // Only check allOf etc if we have validators
        if (context.validatorCount > 0) {
            if (allOf_.schemas)
                for (SizeType i = allOf_.begin; i < allOf_.begin + allOf_.count; i++)
                    if (!context.validators[i]->IsValid()) {
                        context.error_handler.NotAllOf(&context.validators[allOf_.begin], allOf_.count);
                        RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAllOf);
                    }

            if (anyOf_.schemas) {
                for (SizeType i = anyOf_.begin; i < anyOf_.begin + anyOf_.count; i++)
                    if (context.validators[i]->IsValid())
                        goto foundAny;
                context.error_handler.NoneOf(&context.validators[anyOf_.begin], anyOf_.count);
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAnyOf);
                foundAny:;
            }

            if (oneOf_.schemas) {
                bool oneValid = false;
                SizeType firstMatch = 0;
                for (SizeType i = oneOf_.begin; i < oneOf_.begin + oneOf_.count; i++)
                    if (context.validators[i]->IsValid()) {
                        if (oneValid) {
                            context.error_handler.MultipleOneOf(firstMatch, i - oneOf_.begin);
                            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorOneOfMatch);
                        } else {
                            oneValid = true;
                            firstMatch = i - oneOf_.begin;
                        }
                    }
                if (!oneValid) {
                    context.error_handler.NotOneOf(&context.validators[oneOf_.begin], oneOf_.count);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorOneOf);
                }
            }

            if (not_ && context.validators[notValidatorIndex_]->IsValid()) {
                context.error_handler.Disallowed();
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorNot);
            }
        }

        return true;
    }